

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

string * toml::format<char_const(&)[5],std::__cxx11::string_const&,char_const(&)[16]>
                   (stringstream *ss,char (*t) [5],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [16])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  stringstream *in_RDX;
  long in_RSI;
  string *in_RDI;
  char (*in_R8) [16];
  
  std::operator<<((ostream *)(in_RSI + 0x10),(char *)in_RDX);
  format<std::__cxx11::string_const&,char_const(&)[16]>(in_RDX,in_RCX,in_R8);
  return in_RDI;
}

Assistant:

std::string format(std::stringstream& ss, T&& t, Args&&... args)
{
    ss << std::forward<T>(t);
    return format(ss, std::forward<Args>(args)...);
}